

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_lat.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *__s;
  uint64_t uVar6;
  char *pcVar7;
  size_t __size;
  uint uVar8;
  undefined1 auVar9 [16];
  nn_stopwatch sw;
  int opt;
  double local_48;
  double dStack_40;
  
  if (argc != 4) {
    puts("usage: remote_lat <connect-to> <msg-size> <roundtrips>");
    return 1;
  }
  pcVar7 = argv[1];
  uVar1 = atoi(argv[2]);
  uVar2 = atoi(argv[3]);
  iVar3 = nn_socket(1,0x10);
  if (iVar3 == -1) {
    pcVar7 = "s != -1";
    uVar1 = 0x3b;
  }
  else {
    opt = 1;
    iVar4 = nn_setsockopt(iVar3,0xfffffffffffffffd,1,&opt,4);
    if (iVar4 == 0) {
      iVar4 = nn_connect(iVar3,pcVar7);
      if (iVar4 < 0) {
        pcVar7 = "rc >= 0";
        uVar1 = 0x40;
      }
      else {
        __size = (size_t)(int)uVar1;
        __s = malloc(__size);
        if (__s == (void *)0x0) {
          pcVar7 = "buf";
          uVar1 = 0x43;
        }
        else {
          memset(__s,0x6f,__size);
          nn_stopwatch_init(&sw);
          uVar8 = 0xffffffff;
          do {
            uVar8 = uVar8 + 1;
            if (uVar2 == uVar8) {
              uVar6 = nn_stopwatch_term(&sw);
              auVar9._8_4_ = (int)(uVar6 >> 0x20);
              auVar9._0_8_ = uVar6;
              auVar9._12_4_ = 0x45300000;
              dStack_40 = auVar9._8_8_ - 1.9342813113834067e+25;
              local_48 = (dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)
                         ) / (double)(int)(uVar2 * 2);
              printf("message size: %d [B]\n",(ulong)uVar1);
              printf("roundtrip count: %d\n",(ulong)uVar2);
              printf("average latency: %.3f [us]\n");
              free(__s);
              iVar3 = nn_close(iVar3);
              if (iVar3 == 0) {
                return 0;
              }
              pcVar7 = "rc == 0";
              uVar1 = 0x57;
              goto LAB_00101467;
            }
            uVar5 = nn_send(iVar3,__s,__size,0);
            if (uVar5 != uVar1) {
              pcVar7 = "nbytes == (int)sz";
              uVar1 = 0x49;
              goto LAB_00101467;
            }
            uVar5 = nn_recv(iVar3,__s,__size);
          } while (uVar5 == uVar1);
          pcVar7 = "nbytes == (int)sz";
          uVar1 = 0x4b;
        }
      }
    }
    else {
      pcVar7 = "rc == 0";
      uVar1 = 0x3e;
    }
  }
LAB_00101467:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                ,uVar1,"int main(int, char **)");
}

Assistant:

int main (int argc, char *argv [])
{
    const char *connect_to;
    size_t sz;
    int rts;
    char *buf;
    int nbytes;
    int s;
    int rc;
    int i;
    int opt;
    struct nn_stopwatch sw;
    uint64_t total;
    double lat;


    if (argc != 4) {
        printf ("usage: remote_lat <connect-to> <msg-size> <roundtrips>\n");
        return 1;
    }
    connect_to = argv [1];
    sz = atoi (argv [2]);
    rts = atoi (argv [3]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    opt = 1;
    rc = nn_setsockopt (s, NN_TCP, NN_TCP_NODELAY, &opt, sizeof (opt));
    assert (rc == 0);
    rc = nn_connect (s, connect_to);
    assert (rc >= 0);

    buf = malloc (sz);
    assert (buf);
    memset (buf, 111, sz);

    nn_stopwatch_init (&sw);
    for (i = 0; i != rts; i++) {
        nbytes = nn_send (s, buf, sz, 0);
        assert (nbytes == (int)sz);
        nbytes = nn_recv (s, buf, sz, 0);
        assert (nbytes == (int)sz);
    }
    total = nn_stopwatch_term (&sw);

    lat = (double) total / (rts * 2);
    printf ("message size: %d [B]\n", (int) sz);
    printf ("roundtrip count: %d\n", (int) rts);
    printf ("average latency: %.3f [us]\n", (double) lat);

    free (buf);

    rc = nn_close (s);
    assert (rc == 0);

    return 0;
}